

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# demangle.cc
# Opt level: O2

bool google::ParseSourceName(State *state)

{
  char *str;
  int length_00;
  bool bVar1;
  long lVar2;
  long lVar3;
  int length;
  State copy;
  int local_4c;
  char *local_48;
  char *pcStack_40;
  char *local_38;
  char *pcStack_30;
  char *local_28;
  undefined8 uStack_20;
  
  local_48 = state->mangled_cur;
  pcStack_40 = state->out_cur;
  local_38 = state->out_begin;
  pcStack_30 = state->out_end;
  local_28 = state->prev_name;
  uStack_20._0_4_ = state->prev_name_length;
  uStack_20._4_2_ = state->nest_level;
  uStack_20._6_1_ = state->append;
  uStack_20._7_1_ = state->overflowed;
  local_4c = -1;
  bVar1 = ParseNumber(state,&local_4c);
  length_00 = local_4c;
  if ((!bVar1) || (lVar3 = (long)local_4c, lVar3 == -1)) {
LAB_0011a25c:
    state->prev_name = local_28;
    state->prev_name_length = (undefined4)uStack_20;
    state->nest_level = uStack_20._4_2_;
    state->append = (bool)uStack_20._6_1_;
    state->overflowed = (bool)uStack_20._7_1_;
    state->out_begin = local_38;
    state->out_end = pcStack_30;
    state->mangled_cur = local_48;
    state->out_cur = pcStack_40;
    return false;
  }
  str = state->mangled_cur;
  bVar1 = AtLeastNumCharsRemaining(str,local_4c);
  if (!bVar1) goto LAB_0011a25c;
  if (0xb < length_00) {
    lVar2 = 0;
    while( true ) {
      if ((str[lVar2] == '\0') || (str[lVar2] != "_GLOBAL__N_"[lVar2])) break;
      lVar2 = lVar2 + 1;
    }
    if ("_GLOBAL__N_"[lVar2] == '\0') {
      MaybeAppend(state,"(anonymous namespace)");
      goto LAB_0011a294;
    }
  }
  MaybeAppendWithLength(state,str,length_00);
LAB_0011a294:
  state->mangled_cur = state->mangled_cur + lVar3;
  return true;
}

Assistant:

static bool ParseSourceName(State *state) {
  State copy = *state;
  int length = -1;
  if (ParseNumber(state, &length) && ParseIdentifier(state, length)) {
    return true;
  }
  *state = copy;
  return false;
}